

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O3

action_value action_type(char *action_spec)

{
  int iVar1;
  action_value aVar2;
  
  if (action_spec == (char *)0x0) {
    aVar2 = Action_Split;
  }
  else {
    iVar1 = strncmp(action_spec,"Bridge Action",0xd);
    if (iVar1 == 0) {
      aVar2 = Action_Bridge;
    }
    else {
      iVar1 = strncmp(action_spec,"Filter Action",0xd);
      aVar2 = Action_Immediate;
      if (iVar1 != 0) {
        iVar1 = strncmp(action_spec,"Router Action",0xd);
        if (iVar1 != 0) {
          iVar1 = strncmp(action_spec,"Transform Action",0x10);
          if (iVar1 != 0) {
            iVar1 = strncmp(action_spec,"Multityped Action",0x11);
            if (iVar1 == 0) {
              aVar2 = Action_Multi;
            }
            else {
              iVar1 = strncmp(action_spec,"sink:",5);
              if (iVar1 == 0) {
                aVar2 = Action_Terminal;
              }
              else {
                iVar1 = strncmp(action_spec,"source:",7);
                if (iVar1 == 0) {
                  aVar2 = Action_Source;
                }
                else {
                  iVar1 = strncmp(action_spec,"Split Action",7);
                  aVar2 = (uint)(iVar1 == 0) * 9;
                }
              }
            }
          }
        }
      }
    }
  }
  return aVar2;
}

Assistant:

action_value
action_type(char *action_spec)
{
    if (action_spec == NULL)
	return Action_Split;
    if (strncmp(action_spec, "Bridge Action", 13) == 0)
	return Action_Bridge;
    if (strncmp(action_spec, "Filter Action", 13) == 0)
	return Action_Immediate;
    if (strncmp(action_spec, "Router Action", 13) == 0)
	return Action_Immediate;
    if (strncmp(action_spec, "Transform Action", 16) == 0)
	return Action_Immediate;
    if (strncmp(action_spec, "Multityped Action", 17) == 0)
	return Action_Multi;
    if (strncmp(action_spec, "sink:", 5) == 0)
	return Action_Terminal;
    if (strncmp(action_spec, "source:", 7) == 0)
	return Action_Source;
    if (strncmp(action_spec, "Split Action", 7) == 0)
	return Action_Split;
    return Action_NoAction;
}